

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

bool ObjectTemp::IsTempUseOpCodeSym(Instr *instr,OpCode opcode,Sym *sym)

{
  code *pcVar1;
  byte bVar2;
  OpndKind OVar3;
  bool bVar4;
  PropertySym *pPVar5;
  PropertySymOpnd *pPVar6;
  StackSym *pSVar7;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  int iVar10;
  undefined6 in_register_00000032;
  Opnd *pOVar11;
  
  iVar10 = (int)CONCAT62(in_register_00000032,opcode);
  if (iVar10 < 0x97) {
    if (0x6b < iVar10) {
      if (iVar10 < 0x76) {
        if (iVar10 == 0x6c) goto LAB_0063a005;
        if (iVar10 != 0x70) goto LAB_0063a29a;
      }
      else if (iVar10 != 0x76) {
        if (iVar10 != 0x7a) goto LAB_0063a29a;
        pPVar6 = IR::Opnd::AsPropertySymOpnd(instr->m_dst);
        pPVar5 = IR::PropertySymOpnd::GetPropertySym(pPVar6);
        bVar2 = Js::PropertyRecord::DefaultAttributesForPropertyId(pPVar5->m_propertyId,true);
        if ((bVar2 & 8) != 0) {
          return false;
        }
      }
      if ((instr->m_src1 != (Opnd *)0x0) &&
         (pSVar7 = IR::Opnd::GetStackSym(instr->m_src1), pSVar7 == (StackSym *)sym)) {
        return false;
      }
      if ((instr->m_src2 != (Opnd *)0x0) &&
         (pSVar7 = IR::Opnd::GetStackSym(instr->m_src2), pSVar7 == (StackSym *)sym)) {
        return false;
      }
      pOVar11 = instr->m_dst;
LAB_0063a071:
      pPVar6 = IR::Opnd::AsPropertySymOpnd(pOVar11);
      pSVar7 = IR::PropertySymOpnd::GetObjectSym(pPVar6);
LAB_0063a180:
      return pSVar7 == (StackSym *)sym;
    }
    if (iVar10 < 0x66) {
      if (iVar10 == 0x59) goto LAB_0063a2be;
      if (iVar10 == 0x5e) goto LAB_0063a005;
    }
    else if ((iVar10 == 0x66) || (iVar10 == 0x68)) {
LAB_0063a005:
      pOVar11 = instr->m_src1;
      goto LAB_0063a071;
    }
  }
  else if (iVar10 < 0x1de) {
    if (iVar10 < 0x9c) {
      if (iVar10 == 0x97) {
LAB_0063a113:
        pOVar11 = instr->m_src1;
        OVar3 = IR::Opnd::GetKind(pOVar11);
        if (OVar3 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar4) goto LAB_0063a2e1;
          *puVar8 = 0;
        }
        pRVar9 = (RegOpnd *)pOVar11[1]._vptr_Opnd;
LAB_0063a17c:
        pSVar7 = pRVar9->m_sym;
        goto LAB_0063a180;
      }
      if (iVar10 == 0x9a) goto LAB_0063a189;
    }
    else {
      if (iVar10 == 0x9c) {
LAB_0063a189:
        pOVar11 = instr->m_dst;
        OVar3 = IR::Opnd::GetKind(pOVar11);
        if (OVar3 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar4) {
LAB_0063a2e1:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar8 = 0;
        }
        if ((Sym *)pOVar11[1]._vptr_Opnd[2] != sym) {
          return false;
        }
        pSVar7 = IR::Opnd::GetStackSym(instr->m_src1);
        return pSVar7 != (StackSym *)sym;
      }
      if (iVar10 == 0xa6) {
        OVar3 = IR::Opnd::GetKind(instr->m_src1);
        if (OVar3 == OpndKindReg) {
          pOVar11 = instr->m_src1;
          OVar3 = IR::Opnd::GetKind(pOVar11);
          if (OVar3 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar4) goto LAB_0063a2e1;
            *puVar8 = 0;
          }
          pSVar7 = IR::Opnd::GetStackSym(pOVar11);
          goto LAB_0063a180;
        }
        goto LAB_0063a005;
      }
    }
  }
  else if (iVar10 < 0x203) {
    if (iVar10 == 0x1de) {
      return true;
    }
    if (iVar10 == 0x1f5) goto LAB_0063a005;
  }
  else {
    if (iVar10 == 0x203) {
      pOVar11 = instr->m_dst;
      OVar3 = IR::Opnd::GetKind(pOVar11);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_0063a2e1;
        *puVar8 = 0;
      }
      if ((Sym *)pOVar11[1]._vptr_Opnd[2] == sym) {
        return true;
      }
      OVar3 = IR::Opnd::GetKind(instr->m_src1);
      if (OVar3 != OpndKindReg) {
        return false;
      }
      pRVar9 = IR::Opnd::AsRegOpnd(instr->m_src1);
      goto LAB_0063a17c;
    }
    if (iVar10 == 0x204) {
      pOVar11 = instr->m_dst;
      OVar3 = IR::Opnd::GetKind(pOVar11);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_0063a2e1;
        *puVar8 = 0;
      }
      if ((Sym *)pOVar11[1]._vptr_Opnd[2] == sym) {
        return true;
      }
      goto LAB_0063a113;
    }
  }
LAB_0063a29a:
  bVar4 = OpCodeAttr::OpndHasImplicitCall(opcode);
  if ((bVar4) || (bVar4 = OpCodeAttr::TempObjectSources(opcode), !bVar4)) {
    return false;
  }
  bVar4 = OpCodeAttr::TempObjectTransfer(opcode);
  if (!bVar4) {
    return true;
  }
LAB_0063a2be:
  return (bool)((instr->field_0x36 & 8) >> 3);
}

Assistant:

bool
ObjectTemp::IsTempUseOpCodeSym(IR::Instr * instr, Js::OpCode opcode, Sym * sym)
{
    // Special case ArgOut_A which communicate information about CallDirect
    switch (opcode)
    {
    case Js::OpCode::ArgOut_A:
        return instr->dstIsTempObject;
    case Js::OpCode::LdLen_A:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            return instr->GetSrc1()->AsRegOpnd()->GetStackSym() == sym;
        }
        // fall through
    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdMethodFromFlags:
        return instr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym() == sym;
    case Js::OpCode::InitFld:
        if (Js::PropertyRecord::DefaultAttributesForPropertyId(
                instr->GetDst()->AsPropertySymOpnd()->GetPropertySym()->m_propertyId, true) & PropertyDeleted)
        {
            // If the property record is marked PropertyDeleted, the InitFld will cause a type handler conversion,
            // which may result in creation of a weak reference to the object itself.
            return false;
        }
        // Fall through
    case Js::OpCode::StFld:
    case Js::OpCode::StFldStrict:
        return
            !(instr->GetSrc1() && instr->GetSrc1()->GetStackSym() == sym) &&
            !(instr->GetSrc2() && instr->GetSrc2()->GetStackSym() == sym) &&
            instr->GetDst()->AsPropertySymOpnd()->GetObjectSym() == sym;
    case Js::OpCode::LdElemI_A:
        return instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym;
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym && instr->GetSrc1()->GetStackSym() != sym;
    case Js::OpCode::Memset:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym || (instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym == sym);
    case Js::OpCode::Memcopy:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym || instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym;

    // Special case FromVar for now until we can allow CallsValueOf opcode to be accept temp use
    case Js::OpCode::FromVar:
        return true;
    }

    // TODO: Currently, when we disable implicit call, we still don't allow valueOf/toString that has no side effects
    // So we shouldn't mark them if we have use of the sym on opcode that does OpndHasImplicitCall yet.
    if (OpCodeAttr::OpndHasImplicitCall(opcode))
    {
        return false;
    }

    // Mark the symbol as non-tempable if the instruction doesn't allow temp sources,
    // or it is transferred to a non-temp dst
    return (OpCodeAttr::TempObjectSources(opcode)
        && (!OpCodeAttr::TempObjectTransfer(opcode) || instr->dstIsTempObject));
}